

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O1

void __thiscall DBot::Set_enemy(DBot *this)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  
  pAVar3 = (this->enemy).field_0.p;
  if (pAVar3 == (AActor *)0x0) {
LAB_004711b5:
    pAVar4 = (AActor *)0x0;
  }
  else {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
LAB_004711ad:
      (this->enemy).field_0.p = (AActor *)0x0;
      goto LAB_004711b5;
    }
    if (((this->enemy).field_0.p)->health < 1) goto LAB_004711b5;
    pAVar3 = (this->enemy).field_0.p;
    pAVar1 = this->player->mo;
    if ((pAVar3 != (AActor *)0x0) &&
       (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->enemy).field_0.p = (AActor *)0x0;
      pAVar3 = (AActor *)0x0;
    }
    pAVar4 = (AActor *)0x0;
    bVar2 = P_CheckSight(&pAVar1->super_AActor,pAVar3,0);
    if (((bVar2) && (pAVar4 = (this->enemy).field_0.p, pAVar4 != (AActor *)0x0)) &&
       (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) goto LAB_004711ad;
  }
  if ((deathmatch.Value == 0) && (pAVar3 = (this->enemy).field_0.p, pAVar3 != (AActor *)0x0)) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0047120d;
    (this->enemy).field_0.p = (AActor *)0x0;
  }
  pAVar3 = (this->enemy).field_0.p;
  if (pAVar3 == (AActor *)0x0) {
LAB_004711e2:
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->enemy).field_0.p = (AActor *)0x0;
      goto LAB_004711e2;
    }
  }
  this->allround = bVar2;
  pAVar3 = Find_enemy(this);
  (this->enemy).field_0.p = pAVar3;
  if (pAVar3 != (AActor *)0x0) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0047120d;
    (this->enemy).field_0.p = (AActor *)0x0;
  }
  (this->enemy).field_0.p = pAVar4;
LAB_0047120d:
  pAVar3 = (this->enemy).field_0.p;
  if (pAVar3 != (AActor *)0x0) {
    if (((((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) &&
        (-1 < ((this->enemy).field_0.p)->health)) &&
       (((((this->enemy).field_0.p)->flags).Value & 4) != 0)) {
      pAVar3 = (this->enemy).field_0.p;
      pAVar1 = this->player->mo;
      if ((pAVar3 != (AActor *)0x0) &&
         (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->enemy).field_0.p = (AActor *)0x0;
        pAVar3 = (AActor *)0x0;
      }
      bVar2 = AActor::IsFriend(&pAVar1->super_AActor,pAVar3);
      if (!bVar2) {
        return;
      }
    }
    (this->enemy).field_0.p = (AActor *)0x0;
  }
  return;
}

Assistant:

void DBot::Set_enemy ()
{
	AActor *oldenemy;

	if (enemy
		&& enemy->health > 0
		&& P_CheckSight (player->mo, enemy))
	{
		oldenemy = enemy;
	}
	else
	{
		oldenemy = NULL;
	}

	// [RH] Don't even bother looking for a different enemy if this is not deathmatch
	// and we already have an existing enemy.
	if (deathmatch || !enemy)
	{
		allround = !!enemy;
		enemy = Find_enemy();
		if (!enemy)
			enemy = oldenemy; //Try go for last (it will be NULL if there wasn't anyone)
	}
	//Verify that that enemy is really something alive that bot can kill.
	if (enemy && ((enemy->health < 0 || !(enemy->flags&MF_SHOOTABLE)) || player->mo->IsFriend(enemy)))
		enemy = NULL;
}